

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap14_def_char_count(FT_Byte *p)

{
  FT_UInt local_18;
  uint local_14;
  FT_UInt tot;
  FT_UInt32 numRanges;
  FT_Byte *p_local;
  
  local_18 = 0;
  _tot = p + 7;
  for (local_14 = (uint)*p << 0x18 | (uint)p[1] << 0x10 | (uint)p[2] << 8 | (uint)p[3];
      local_14 != 0; local_14 = local_14 - 1) {
    local_18 = *_tot + 1 + local_18;
    _tot = _tot + 4;
  }
  return local_18;
}

Assistant:

static FT_UInt
  tt_cmap14_def_char_count( FT_Byte  *p )
  {
    FT_UInt32  numRanges = (FT_UInt32)TT_NEXT_ULONG( p );
    FT_UInt    tot       = 0;


    p += 3;  /* point to the first `cnt' field */
    for ( ; numRanges > 0; numRanges-- )
    {
      tot += 1 + p[0];
      p   += 4;
    }

    return tot;
  }